

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_check_union_field(flatcc_builder_t *B,flatbuffers_voffset_t id)

{
  flatbuffers_voffset_t id_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type == 3) {
    if ((id == 0) || (B->id_end <= id)) {
      B_local._4_4_ = 0;
    }
    else if (B->vs[(int)(id - 1)] == 0) {
      B_local._4_4_ = (uint)(B->vs[id] == 0);
    }
    else if (B->ds[(int)(uint)B->vs[(int)(id - 1)]] == '\0') {
      B_local._4_4_ = (uint)(B->vs[id] == 0);
    }
    else {
      B_local._4_4_ = (uint)(B->vs[id] != 0);
    }
    return B_local._4_4_;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x514,
                "int flatcc_builder_check_union_field(flatcc_builder_t *, flatbuffers_voffset_t)");
}

Assistant:

int flatcc_builder_check_union_field(flatcc_builder_t *B, flatbuffers_voffset_t id)
{
    check(frame(type) == flatcc_builder_table, "expected table frame");

    if (id == 0 || id >= B->id_end) {
        return 0;
    }
    if (B->vs[id - 1] == 0) {
        return B->vs[id] == 0;
    }
    if (*(uint8_t *)(B->ds + B->vs[id - 1])) {
        return B->vs[id] != 0;
    }
    return B->vs[id] == 0;
}